

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Instruction *i,bool sparse,
          bool *forward,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  uint32_t uVar3;
  ID id;
  uint32_t uVar4;
  uint uVar5;
  size_t sVar6;
  Variant *pVVar7;
  string *expr_00;
  SPIRType *out_type;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  uint32_t *puVar12;
  SPIRVariable *pSVar13;
  SPIRType *pSVar14;
  ulong uVar15;
  const_iterator cVar16;
  SPIRCombinedImageSampler *pSVar17;
  CompilerError *this_00;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  char (*ts_3) [2];
  int iVar23;
  int iVar24;
  ID id_00;
  ulong uVar25;
  string *expr;
  uint32_t local_17c;
  uint local_174;
  uint32_t local_16c;
  undefined1 local_164;
  uint local_160;
  undefined1 local_15c;
  uint *local_158;
  uint local_14c;
  int local_124;
  string local_f8;
  uint32_t local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint32_t uStack_c0;
  uint uStack_bc;
  int local_b8;
  uint uStack_b4;
  ulong uStack_b0;
  string *local_a8;
  string local_a0;
  SPIRType *local_80;
  string local_78;
  uint32_t local_58;
  undefined4 local_54;
  SPIRType *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  local_a8 = __return_storage_ptr__;
  puVar12 = Compiler::stream(&this->super_Compiler,i);
  uVar2 = i->op;
  uVar3 = i->length;
  id.id = puVar12[2];
  uVar25 = (ulong)id.id;
  uVar4 = puVar12[3];
  local_80 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *puVar12);
  SmallVector<unsigned_int,_8UL>::reserve
            (inherited_expressions,
             (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
  sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
  (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = uVar4;
  (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
  bVar8 = Compiler::has_decoration(&this->super_Compiler,id,DecorationNonUniform);
  if (bVar8) {
    pSVar13 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id.id);
    bVar8 = pSVar13 == (SPIRVariable *)0x0;
  }
  else {
    bVar8 = false;
  }
  switch(uVar2) {
  case 0x59:
  case 0x5a:
switchD_002708bf_caseD_133:
    local_17c = puVar12[4];
    local_158 = puVar12 + 5;
    iVar23 = uVar3 - 5;
    goto LAB_002708ea;
  case 0x5b:
  case 0x5c:
switchD_002708bf_caseD_135:
    local_158 = puVar12 + 4;
    iVar23 = uVar3 - 4;
    bVar9 = 1;
    local_17c = 0;
    local_164 = 0;
    break;
  case 0x5d:
  case 0x5e:
switchD_002708bf_caseD_137:
    local_17c = puVar12[4];
    local_158 = puVar12 + 5;
    iVar23 = uVar3 - 5;
    local_164 = 0;
    bVar9 = 1;
    break;
  case 0x5f:
  case 0x62:
switchD_002708bf_caseD_139:
    local_158 = puVar12 + 4;
    iVar23 = uVar3 - 4;
    local_164 = 1;
    local_17c = 0;
    goto LAB_00270967;
  case 0x60:
switchD_002708bf_caseD_13a:
    bVar10 = (this->options).es;
    uVar21 = (this->options).version;
    if ((uVar21 < 0x136 & bVar10) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather requires ESSL 310.");
LAB_002714a1:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_16c = puVar12[4];
    local_158 = puVar12 + 5;
    iVar23 = uVar3 - 5;
    local_15c = 1;
    if (bVar10 == false && uVar21 < 400) {
      bVar10 = expression_is_constant_null(this,local_16c);
      if (!bVar10) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"textureGather with component requires GLSL 400.");
        goto LAB_002714a1;
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"GL_ARB_texture_gather","");
      require_extension_internal(this,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      local_17c = 0;
      local_164 = 0;
      bVar9 = 0;
    }
    else {
      local_17c = 0;
      local_164 = 0;
      bVar9 = 0;
    }
    goto LAB_0027097f;
  case 0x61:
switchD_002708bf_caseD_13b:
    bVar10 = (this->options).es;
    uVar21 = (this->options).version;
    if ((uVar21 < 0x136 & bVar10) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather requires ESSL 310.");
      goto LAB_002714a1;
    }
    if (bVar10 == false && uVar21 < 400) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather with depth compare requires GLSL 400.");
      goto LAB_002714a1;
    }
    iVar23 = uVar3 - 5;
    local_158 = puVar12 + 5;
    local_17c = puVar12[4];
    local_164 = 0;
    local_15c = 1;
    bVar9 = 0;
    goto LAB_00270977;
  default:
    switch(uVar2) {
    case 0x133:
    case 0x134:
      goto switchD_002708bf_caseD_133;
    case 0x135:
    case 0x136:
      goto switchD_002708bf_caseD_135;
    case 0x137:
    case 0x138:
      goto switchD_002708bf_caseD_137;
    case 0x139:
      goto switchD_002708bf_caseD_139;
    case 0x13a:
      goto switchD_002708bf_caseD_13a;
    case 0x13b:
      goto switchD_002708bf_caseD_13b;
    default:
      local_158 = puVar12 + 4;
      iVar23 = uVar3 - 4;
      local_17c = 0;
    }
LAB_002708ea:
    local_164 = 0;
LAB_00270967:
    bVar9 = 0;
  }
  local_15c = 0;
LAB_00270977:
  local_16c = 0;
LAB_0027097f:
  pSVar14 = Compiler::expression_type(&this->super_Compiler,id.id);
  pSVar14 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                       (pSVar14->super_IVariant).self.id);
  uVar15 = (ulong)(pSVar14->image).dim;
  local_124 = 2;
  if (uVar15 < 6) {
    local_124 = *(int *)(&DAT_00305ed0 + uVar15 * 4);
  }
  if (local_17c != 0) {
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = local_17c;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
  }
  bVar10 = (pSVar14->image).arrayed;
  uVar21 = 0;
  if (iVar23 == 0) {
    uVar20 = 0;
    local_14c = 0;
LAB_00270a7f:
    uVar11 = 0;
    uVar22 = 0;
    local_174 = 0;
    local_160 = 0;
    uVar18 = 0;
LAB_00270a86:
    uVar21 = 0;
    uVar19 = 0;
  }
  else {
    uVar22 = 0;
    uVar11 = 0;
    uVar20 = 0;
    local_14c = 0;
    local_174 = 0;
    local_160 = 0;
    uVar18 = 0;
    uVar19 = 0;
    iVar24 = iVar23 + -1;
    if (iVar24 != 0) {
      uVar5 = *local_158;
      if ((uVar5 & 1) == 0) {
        local_158 = local_158 + 1;
        local_14c = 0;
      }
      else {
        local_14c = local_158[1];
        SmallVector<unsigned_int,_8UL>::reserve
                  (inherited_expressions,
                   (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
        sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
        (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = local_14c;
        (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
        iVar24 = iVar23 + -2;
        if (iVar24 == 0) {
          uVar20 = 0;
          goto LAB_00270a7f;
        }
        local_158 = local_158 + 2;
      }
      uVar20 = 0;
      if ((uVar5 & 2) != 0) {
        uVar20 = *local_158;
        SmallVector<unsigned_int,_8UL>::reserve
                  (inherited_expressions,
                   (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
        sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
        (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = uVar20;
        (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
        iVar24 = iVar24 + -1;
        if (iVar24 == 0) goto LAB_00270a7f;
        local_158 = local_158 + 1;
      }
      local_160 = 0;
      if ((uVar5 & 4) == 0) {
        local_174 = 0;
        uVar11 = 0;
LAB_0027118a:
        if ((uVar5 & 8) == 0) {
LAB_002711cf:
          if ((uVar5 & 0x10) == 0) {
            uVar22 = 0;
          }
          else {
            uVar22 = *local_158;
            SmallVector<unsigned_int,_8UL>::reserve
                      (inherited_expressions,
                       (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
            sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
            (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = uVar22;
            (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
            iVar24 = iVar24 + -1;
            if (iVar24 == 0) goto LAB_00271390;
            local_158 = local_158 + 1;
          }
          uVar18 = 0;
          if ((uVar5 & 0x20) != 0) {
            uVar18 = *local_158;
            SmallVector<unsigned_int,_8UL>::reserve
                      (inherited_expressions,
                       (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
            sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
            (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = uVar18;
            (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
            iVar24 = iVar24 + -1;
            if (iVar24 == 0) goto LAB_00270a86;
            local_158 = local_158 + 1;
          }
          if ((uVar5 & 0x40) == 0) {
            uVar21 = 0;
          }
          else {
            uVar21 = *local_158;
            SmallVector<unsigned_int,_8UL>::reserve
                      (inherited_expressions,
                       (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
            sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
            (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = uVar21;
            (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
            if (iVar24 == 1) {
              uVar19 = 0;
              goto LAB_00270a88;
            }
            local_158 = local_158 + 1;
          }
          uVar19 = 0;
          if ((char)uVar5 < '\0') {
            uVar19 = *local_158;
            SmallVector<unsigned_int,_8UL>::reserve
                      (inherited_expressions,
                       (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
            sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
            (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = uVar19;
            (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
          }
        }
        else {
          local_160 = *local_158;
          SmallVector<unsigned_int,_8UL>::reserve
                    (inherited_expressions,
                     (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
          sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
          (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = local_160;
          (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
          iVar24 = iVar24 + -1;
          if (iVar24 != 0) {
            local_158 = local_158 + 1;
            goto LAB_002711cf;
          }
          uVar22 = 0;
LAB_00271390:
          uVar19 = 0;
          uVar18 = 0;
          uVar21 = 0;
        }
      }
      else {
        local_174 = *local_158;
        SmallVector<unsigned_int,_8UL>::reserve
                  (inherited_expressions,
                   (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
        sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
        (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = local_174;
        (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
        uVar21 = 0;
        if (iVar24 == 1) {
          uVar22 = 0;
          uVar11 = 0;
          local_160 = 0;
          uVar18 = 0;
          uVar19 = 0;
        }
        else {
          uVar11 = local_158[1];
          SmallVector<unsigned_int,_8UL>::reserve
                    (inherited_expressions,
                     (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
          sVar6 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
          (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar6] = uVar11;
          (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar6 + 1;
          iVar24 = iVar24 + -2;
          if (iVar24 != 0) {
            local_158 = local_158 + 2;
            goto LAB_0027118a;
          }
          uVar22 = 0;
          local_160 = 0;
          uVar18 = 0;
          uVar19 = 0;
          uVar21 = 0;
        }
      }
    }
  }
LAB_00270a88:
  expr_00 = local_a8;
  local_54 = 0;
  ts_3 = (char (*) [2])(ulong)uVar18;
  local_48 = (ulong)CONCAT12(bVar9,CONCAT11(local_15c,local_164));
  (local_a8->_M_dataplus)._M_p = (pointer)&local_a8->field_2;
  uStack_40 = (ulong)CONCAT15(uVar19 != 0,
                              CONCAT14(sparse,CONCAT13(local_17c != 0,
                                                       CONCAT12(local_174 != 0 || uVar11 != 0,
                                                                CONCAT11(local_160 != 0 ||
                                                                         uVar22 != 0,uVar18 != 0))))
                             );
  local_a8->_M_string_length = 0;
  (local_a8->field_2)._M_local_buf[0] = '\0';
  local_38 = (ulong)uVar20;
  local_58 = id.id;
  local_50 = pSVar14;
  (*(this->super_Compiler)._vptr_Compiler[0x1e])(&local_f8,this);
  ::std::__cxx11::string::_M_append((char *)expr_00,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)expr_00);
  iVar23 = 0;
  if (sparse) {
    local_f8._M_dataplus._M_p._0_4_ = puVar12[1];
    cVar16 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->extra_sub_expressions)._M_h,(key_type_conflict *)&local_f8);
    if (cVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) {
      iVar23 = 0;
    }
    else {
      iVar23 = *(int *)((long)cVar16.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 0xc) + 1;
    }
  }
  local_f8._M_dataplus._M_p._4_4_ = 0;
  local_f8._M_dataplus._M_p._0_4_ = id.id;
  local_f8.field_2._M_local_buf[1] = local_15c;
  local_f8.field_2._M_local_buf[0] = local_164;
  local_f8.field_2._M_local_buf[2] = bVar9;
  local_f8.field_2._M_allocated_capacity._3_5_ = 0;
  local_f8.field_2._12_4_ = local_124 + (uint)bVar9 + (uint)bVar10;
  local_f8.field_2._8_4_ = uVar4;
  _local_d8 = CONCAT44(local_174,local_17c);
  _uStack_d0 = CONCAT44(uVar20,uVar11);
  uVar20 = uVar18;
  if ((uVar18 == 0) && (uVar20 = local_160, local_160 == 0)) {
    uVar20 = uVar22;
  }
  _local_c8 = CONCAT44(local_14c,uVar20);
  _uStack_c0 = CONCAT44(uVar21,local_16c);
  _local_b8 = CONCAT44(uVar19,iVar23);
  uStack_b0 = (ulong)CONCAT11(uVar18 != 0,bVar8);
  local_f8._M_string_length = (size_type)pSVar14;
  (*(this->super_Compiler)._vptr_Compiler[0x1f])(&local_a0,this,&local_f8,forward);
  ::std::__cxx11::string::_M_append((char *)expr_00,(ulong)local_a0._M_dataplus._M_p);
  out_type = local_80;
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)expr_00);
  if ((((this->options).es == false) && ((this->options).version < 0x82)) &&
     (bVar8 = Compiler::is_depth_image(&this->super_Compiler,pSVar14,id.id), bVar8)) {
    ::std::__cxx11::string::append((char *)expr_00);
  }
  uVar21 = (uint)uVar2;
  if (((this->backend).comparison_image_samples_scalar != true) ||
     (((0xb < uVar21 - 0x57 || ((0x933U >> (uVar21 - 0x57 & 0x1f) & 1) == 0)) &&
      ((0xf < uVar21 - 0x131 || ((0x8133U >> (uVar21 - 0x131 & 0x1f) & 1) == 0))))))
  goto LAB_00270f30;
  id_00.id = id.id;
  if ((uVar25 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar7 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar7[uVar25].type == TypeCombinedImageSampler)) {
    pSVar17 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar7 + uVar25);
    id_00.id = (pSVar17->image).id;
    bVar8 = Compiler::is_depth_image(&this->super_Compiler,pSVar14,id_00.id);
    bVar10 = true;
    if (!bVar8) goto LAB_00270ea3;
  }
  else {
LAB_00270ea3:
    bVar10 = Compiler::is_depth_image(&this->super_Compiler,pSVar14,id.id);
  }
  pSVar13 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id_00.id);
  if (pSVar13 == (SPIRVariable *)0x0) {
    if (bVar10 == false) goto LAB_00270f30;
  }
  else {
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar13->super_IVariant).field_0xc);
    bVar8 = Compiler::is_depth_image
                      (&this->super_Compiler,pSVar14,(pSVar13->super_IVariant).self.id);
    if (!bVar8 && bVar10 == false) goto LAB_00270f30;
  }
  remap_swizzle(&local_a0,this,out_type,1,expr_00);
  ::std::__cxx11::string::operator=((string *)expr_00,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
LAB_00270f30:
  if (((!sparse) && ((this->backend).support_small_type_sampling_result == false)) &&
     (out_type->width < 0x20)) {
    type_to_glsl_constructor_abi_cxx11_(&local_78,this,out_type);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_a0,(spirv_cross *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3040b9,
               (char (*) [2])expr_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30f9b8,ts_3);
    ::std::__cxx11::string::operator=((string *)expr_00,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (uVar21 == 0x62) {
    remap_swizzle(&local_a0,this,out_type,4,expr_00);
    ::std::__cxx11::string::operator=((string *)expr_00,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  return expr_00;
}

Assistant:

std::string CompilerGLSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                        SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);
	uint32_t length = i.length;

	uint32_t result_type_id = ops[0];
	VariableID img = ops[2];
	uint32_t coord = ops[3];
	uint32_t dref = 0;
	uint32_t comp = 0;
	bool gather = false;
	bool proj = false;
	bool fetch = false;
	bool nonuniform_expression = false;
	const uint32_t *opt = nullptr;

	auto &result_type = get<SPIRType>(result_type_id);

	inherited_expressions.push_back(coord);
	if (has_decoration(img, DecorationNonUniform) && !maybe_get_backing_variable(img))
		nonuniform_expression = true;

	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		break;

	case OpImageSampleProjDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		proj = true;
		break;

	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("textureGather with depth compare requires GLSL 400.");
		break;

	case OpImageGather:
	case OpImageSparseGather:
		comp = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
		{
			if (!expression_is_constant_null(comp))
				SPIRV_CROSS_THROW("textureGather with component requires GLSL 400.");
			require_extension_internal("GL_ARB_texture_gather");
		}
		break;

	case OpImageFetch:
	case OpImageSparseFetch:
	case OpImageRead: // Reads == fetches in Metal (other langs will not get here)
		opt = &ops[4];
		length -= 4;
		fetch = true;
		break;

	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
		opt = &ops[4];
		length -= 4;
		proj = true;
		break;

	default:
		opt = &ops[4];
		length -= 4;
		break;
	}

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	uint32_t coord_components = 0;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		coord_components = 1;
		break;
	case spv::Dim2D:
		coord_components = 2;
		break;
	case spv::Dim3D:
		coord_components = 3;
		break;
	case spv::DimCube:
		coord_components = 3;
		break;
	case spv::DimBuffer:
		coord_components = 1;
		break;
	default:
		coord_components = 2;
		break;
	}

	if (dref)
		inherited_expressions.push_back(dref);

	if (proj)
		coord_components++;
	if (imgtype.image.arrayed)
		coord_components++;

	uint32_t bias = 0;
	uint32_t lod = 0;
	uint32_t grad_x = 0;
	uint32_t grad_y = 0;
	uint32_t coffset = 0;
	uint32_t offset = 0;
	uint32_t coffsets = 0;
	uint32_t sample = 0;
	uint32_t minlod = 0;
	uint32_t flags = 0;

	if (length)
	{
		flags = *opt++;
		length--;
	}

	auto test = [&](uint32_t &v, uint32_t flag) {
		if (length && (flags & flag))
		{
			v = *opt++;
			inherited_expressions.push_back(v);
			length--;
		}
	};

	test(bias, ImageOperandsBiasMask);
	test(lod, ImageOperandsLodMask);
	test(grad_x, ImageOperandsGradMask);
	test(grad_y, ImageOperandsGradMask);
	test(coffset, ImageOperandsConstOffsetMask);
	test(offset, ImageOperandsOffsetMask);
	test(coffsets, ImageOperandsConstOffsetsMask);
	test(sample, ImageOperandsSampleMask);
	test(minlod, ImageOperandsMinLodMask);

	TextureFunctionBaseArguments base_args = {};
	base_args.img = img;
	base_args.imgtype = &imgtype;
	base_args.is_fetch = fetch != 0;
	base_args.is_gather = gather != 0;
	base_args.is_proj = proj != 0;

	string expr;
	TextureFunctionNameArguments name_args = {};

	name_args.base = base_args;
	name_args.has_array_offsets = coffsets != 0;
	name_args.has_offset = coffset != 0 || offset != 0;
	name_args.has_grad = grad_x != 0 || grad_y != 0;
	name_args.has_dref = dref != 0;
	name_args.is_sparse_feedback = sparse;
	name_args.has_min_lod = minlod != 0;
	name_args.lod = lod;
	expr += to_function_name(name_args);
	expr += "(";

	uint32_t sparse_texel_id = 0;
	if (sparse)
		sparse_texel_id = get_sparse_feedback_texel_id(ops[1]);

	TextureFunctionArguments args = {};
	args.base = base_args;
	args.coord = coord;
	args.coord_components = coord_components;
	args.dref = dref;
	args.grad_x = grad_x;
	args.grad_y = grad_y;
	args.lod = lod;
	args.has_array_offsets = coffsets != 0;

	if (coffsets)
		args.offset = coffsets;
	else if (coffset)
		args.offset = coffset;
	else
		args.offset = offset;

	args.bias = bias;
	args.component = comp;
	args.sample = sample;
	args.sparse_texel = sparse_texel_id;
	args.min_lod = minlod;
	args.nonuniform_expression = nonuniform_expression;
	expr += to_function_args(args, forward);
	expr += ")";

	// texture(samplerXShadow) returns float. shadowX() returns vec4, but only in desktop GLSL. Swizzle here.
	if (is_legacy() && !options.es && is_depth_image(imgtype, img))
		expr += ".r";

	// Sampling from a texture which was deduced to be a depth image, might actually return 1 component here.
	// Remap back to 4 components as sampling opcodes expect.
	if (backend.comparison_image_samples_scalar && image_opcode_is_sample_no_dref(op))
	{
		bool image_is_depth = false;
		const auto *combined = maybe_get<SPIRCombinedImageSampler>(img);
		VariableID image_id = combined ? combined->image : img;

		if (combined && is_depth_image(imgtype, combined->image))
			image_is_depth = true;
		else if (is_depth_image(imgtype, img))
			image_is_depth = true;

		// We must also check the backing variable for the image.
		// We might have loaded an OpImage, and used that handle for two different purposes.
		// Once with comparison, once without.
		auto *image_variable = maybe_get_backing_variable(image_id);
		if (image_variable && is_depth_image(get<SPIRType>(image_variable->basetype), image_variable->self))
			image_is_depth = true;

		if (image_is_depth)
			expr = remap_swizzle(result_type, 1, expr);
	}

	if (!sparse && !backend.support_small_type_sampling_result && result_type.width < 32)
	{
		// Just value cast (narrowing) to expected type since we cannot rely on narrowing to work automatically.
		// Hopefully compiler picks this up and converts the texturing instruction to the appropriate precision.
		expr = join(type_to_glsl_constructor(result_type), "(", expr, ")");
	}

	// Deals with reads from MSL. We might need to downconvert to fewer components.
	if (op == OpImageRead)
		expr = remap_swizzle(result_type, 4, expr);

	return expr;
}